

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_utilities.c
# Opt level: O0

char * next_token(char *s,char delim)

{
  char *s_00;
  char *pcVar1;
  char *local_20;
  char *rc;
  char delim_local;
  char *s_local;
  
  if (s != (char *)0x0) {
    next_token::p = s;
  }
  s_00 = next_token::p;
  local_20 = next_token::p;
  if (next_token::p != (char *)0x0) {
    pcVar1 = strchr(next_token::p,(int)delim);
    if (pcVar1 == (char *)0x0) {
      next_token::p = (char *)0x0;
    }
    else {
      *pcVar1 = '\0';
      next_token::p = pcVar1 + 1;
    }
    local_20 = trim(s_00);
  }
  return local_20;
}

Assistant:

char * next_token( char * s, char delim )
{
    static char * p = NULL;
    char * rc;

    if ( s != NULL )
    {
        /* Re-init the to-be-tokenized string */
        p = s;
    }

    /* Remembering the start of the next token */
    rc = p;

    /* In case the function has not been initialized, or the previous
       string been exhaused, do nothing.
    */
    if ( p )
    {
        /* Re-using s here */
        if ( ( s = strchr( p, delim ) ) )
        {
            /* Null the delimiter */
            *s = '\0';
            /* Make the internal, static pointer point to the next token */
            p = s + 1;
        }
        else
        {
            /* Delimiter not found, end-of-string reached. */
            p = NULL;
        }

        /* Trim the result */
        rc = trim( rc );
    }

    return rc;
}